

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexBuffer.cpp
# Opt level: O3

void __thiscall IndexBuffer::IndexBuffer(IndexBuffer *this,uint *data,uint count)

{
  bool bVar1;
  int iVar2;
  int lineNo;
  int lineNo_00;
  
  this->_count = count;
  do {
    iVar2 = glGetError();
  } while (iVar2 != 0);
  (*___glewGenBuffers)(1,this);
  bVar1 = GlLogCall("glGenBuffers(1, &_rendererId)",(char *)0x7,lineNo);
  if (!bVar1) {
    raise(5);
  }
  Bind(this);
  do {
    iVar2 = glGetError();
  } while (iVar2 != 0);
  (*___glewBufferData)(0x8893,(ulong)count << 2,data,0x88e4);
  bVar1 = GlLogCall("glBufferData(GL_ELEMENT_ARRAY_BUFFER, count * sizeof(unsigned int), data, GL_STATIC_DRAW)"
                    ,(char *)0x9,lineNo_00);
  if (bVar1) {
    return;
  }
  raise(5);
  return;
}

Assistant:

IndexBuffer::IndexBuffer(const unsigned int *data, unsigned int count) : _count(count)
{
    GL_CALL(glGenBuffers(1, &_rendererId));
    Bind();
    GL_CALL(glBufferData(GL_ELEMENT_ARRAY_BUFFER, count * sizeof(unsigned int), data, GL_STATIC_DRAW));
}